

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxBinaryLogical::Resolve(FxBinaryLogical *this,FCompileContext *ctx)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  FxExpression *pFVar3;
  FxBoolCast *pFVar4;
  FxExpression *pFVar5;
  undefined4 extraout_var_02;
  FxConstant *this_00;
  _func_int **pp_Var6;
  PType *pPVar7;
  uint uVar8;
  FCompileContext *o;
  uint uVar9;
  ExpVal EStack_38;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  pFVar3 = this->left;
  if (pFVar3 != (FxExpression *)0x0) {
    iVar2 = (*pFVar3->_vptr_FxExpression[2])(pFVar3,ctx);
    this->left = (FxExpression *)CONCAT44(extraout_var,iVar2);
  }
  if (this->right == (FxExpression *)0x0) {
LAB_0050f48a:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return (FxExpression *)0x0;
  }
  o = ctx;
  iVar2 = (*this->right->_vptr_FxExpression[2])();
  pFVar3 = (FxExpression *)CONCAT44(extraout_var_00,iVar2);
  this->right = pFVar3;
  if ((pFVar3 == (FxExpression *)0x0) || (pFVar5 = this->left, pFVar5 == (FxExpression *)0x0))
  goto LAB_0050f48a;
  pPVar7 = pFVar5->ValueType;
  if (pFVar5->ValueType != (PType *)TypeBool) {
    pFVar4 = (FxBoolCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)o);
    FxBoolCast::FxBoolCast(pFVar4,this->left,true);
    this->left = (FxExpression *)pFVar4;
    o = ctx;
    iVar2 = (*(pFVar4->super_FxExpression)._vptr_FxExpression[2])(pFVar4);
    pFVar5 = (FxExpression *)CONCAT44(extraout_var_01,iVar2);
    this->left = pFVar5;
    if (pFVar5 == (FxExpression *)0x0) goto LAB_0050f48a;
    pFVar3 = this->right;
    pPVar7 = (PType *)TypeBool;
  }
  if (pFVar3->ValueType != pPVar7) {
    pFVar4 = (FxBoolCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)o);
    FxBoolCast::FxBoolCast(pFVar4,this->right,true);
    this->right = (FxExpression *)pFVar4;
    iVar2 = (*(pFVar4->super_FxExpression)._vptr_FxExpression[2])(pFVar4);
    this->right = (FxExpression *)CONCAT44(extraout_var_02,iVar2);
    if ((FxExpression *)CONCAT44(extraout_var_02,iVar2) == (FxExpression *)0x0) goto LAB_0050f48a;
    pFVar5 = this->left;
    o = ctx;
  }
  iVar2 = (*pFVar5->_vptr_FxExpression[3])(pFVar5);
  uVar8 = 0xffffffff;
  uVar9 = uVar8;
  if ((char)iVar2 != '\0') {
    o = (FCompileContext *)(this->left + 1);
    ExpVal::ExpVal(&EStack_38,(ExpVal *)o);
    bVar1 = ExpVal::GetBool(&EStack_38);
    uVar9 = (uint)bVar1;
    ExpVal::~ExpVal(&EStack_38);
  }
  iVar2 = (*this->right->_vptr_FxExpression[3])();
  if ((char)iVar2 != '\0') {
    o = (FCompileContext *)(this->right + 1);
    ExpVal::ExpVal(&EStack_38,(ExpVal *)o);
    bVar1 = ExpVal::GetBool(&EStack_38);
    uVar8 = (uint)bVar1;
    ExpVal::~ExpVal(&EStack_38);
  }
  if (this->Operator == 0x11c) {
    if (uVar9 == 1 || uVar8 == 1) goto LAB_0050f4b6;
    if (uVar8 != 0 || uVar9 != 0) {
      if (uVar9 == 0) {
LAB_0050f50e:
        pp_Var6 = (this->super_FxExpression)._vptr_FxExpression;
        this_00 = (FxConstant *)this->right;
        this->right = (FxExpression *)0x0;
        goto LAB_0050f503;
      }
      if (uVar8 != 0) goto LAB_0050f4dd;
LAB_0050f47c:
      pp_Var6 = (this->super_FxExpression)._vptr_FxExpression;
      this_00 = (FxConstant *)this->left;
      this->left = (FxExpression *)0x0;
      goto LAB_0050f503;
    }
LAB_0050f4e7:
    this_00 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)o);
    bVar1 = false;
  }
  else {
    if (this->Operator != 0x11b) {
LAB_0050f4dd:
      Flatten(this);
      return &this->super_FxExpression;
    }
    if (uVar9 != 0 && uVar8 != 0) {
      if (uVar8 == 1 && uVar9 == 1) goto LAB_0050f4e7;
      if (uVar9 == 1) goto LAB_0050f50e;
      if (uVar8 != 1) goto LAB_0050f4dd;
      goto LAB_0050f47c;
    }
LAB_0050f4b6:
    this_00 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)o);
    bVar1 = true;
  }
  FxConstant::FxConstant(this_00,bVar1,&(this->super_FxExpression).ScriptPosition);
  pp_Var6 = (this->super_FxExpression)._vptr_FxExpression;
LAB_0050f503:
  (*pp_Var6[1])(this);
  return &this_00->super_FxExpression;
}

Assistant:

FxExpression *FxBinaryLogical::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	RESOLVE(left, ctx);
	RESOLVE(right, ctx);
	ABORT(right && left);

	if (left->ValueType != TypeBool)
	{
		left = new FxBoolCast(left);
		SAFE_RESOLVE(left, ctx);
	}
	if (right->ValueType != TypeBool)
	{
		right = new FxBoolCast(right);
		SAFE_RESOLVE(right, ctx);
	}

	int b_left=-1, b_right=-1;
	if (left->isConstant()) b_left = static_cast<FxConstant *>(left)->GetValue().GetBool();
	if (right->isConstant()) b_right = static_cast<FxConstant *>(right)->GetValue().GetBool();

	// Do some optimizations. This will throw out all sub-expressions that are not
	// needed to retrieve the final result.
	if (Operator == TK_AndAnd)
	{
		if (b_left==0 || b_right==0)
		{
			FxExpression *x = new FxConstant(true, ScriptPosition);
			delete this;
			return x;
		}
		else if (b_left==1 && b_right==1)
		{
			FxExpression *x = new FxConstant(false, ScriptPosition);
			delete this;
			return x;
		}
		else if (b_left==1)
		{
			FxExpression *x = right;
			right=nullptr;
			delete this;
			return x;
		}
		else if (b_right==1)
		{
			FxExpression *x = left;
			left=nullptr;
			delete this;
			return x;
		}
	}
	else if (Operator == TK_OrOr)
	{
		if (b_left==1 || b_right==1)
		{
			FxExpression *x = new FxConstant(true, ScriptPosition);
			delete this;
			return x;
		}
		if (b_left==0 && b_right==0)
		{
			FxExpression *x = new FxConstant(false, ScriptPosition);
			delete this;
			return x;
		}
		else if (b_left==0)
		{
			FxExpression *x = right;
			right=nullptr;
			delete this;
			return x;
		}
		else if (b_right==0)
		{
			FxExpression *x = left;
			left=nullptr;
			delete this;
			return x;
		}
	}
	Flatten();
	return this;
}